

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *
testing::internal::
CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<void(*)(int_const*,int,int,unsigned_char*),int>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>const,testing::internal::ParamIteratorInterface<std::tuple<void(*)(int_const*,int,int,unsigned_char*),int>>const>
          (ParamIteratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>
           *base)

{
  bool bVar1;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *pIVar2;
  undefined8 uVar3;
  GTestLog local_c;
  
  if (base != (ParamIteratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>
               *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)base->_vptr_ParamIteratorInterface[-1],
                       (type_info *)
                       &CartesianProductGenerator<void(*)(int_const*,int,int,unsigned_char*),int>::
                        IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::typeinfo);
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x45e);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_c);
    }
    pIVar2 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)
             __dynamic_cast(base,&ParamIteratorInterface<std::tuple<void(*)(int_const*,int,int,unsigned_char*),int>>
                                  ::typeinfo,
                            &CartesianProductGenerator<void(*)(int_const*,int,int,unsigned_char*),int>
                             ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::typeinfo,0);
    return pIVar2;
  }
  uVar3 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar3);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}